

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderPerformanceCase::setVertexFragmentRatio
          (ShaderPerformanceCase *this,float fragmentsPerVertices)

{
  ostringstream *this_00;
  bool bVar1;
  int i;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int precision;
  int precision_00;
  int gridW;
  int gridH;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_1f8;
  string local_1f0;
  string local_1d0;
  MessageBuilder local_1b0;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)CONCAT44(extraout_var,iVar2);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 4);
  gridH = 0xff;
  gridW = 0xff;
  for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
    fVar6 = (float)((gridH + 1) * (gridW + 1));
    local_1f8 = (float)(iVar3 * iVar2) / fVar6;
    fVar7 = local_1f8 - fragmentsPerVertices;
    fVar5 = -fVar7;
    if (-fVar7 <= fVar7) {
      fVar5 = fVar7;
    }
    if (fVar5 < 0.01) goto LAB_0082ef95;
    if (fragmentsPerVertices <= local_1f8) {
      fVar6 = fVar6 * fragmentsPerVertices;
      for (; (int)(fVar6 + *(float *)(&DAT_009ed69c + (ulong)(fVar6 < 0.0) * 4)) < iVar3 * iVar2;
          iVar3 = iVar3 - (uint)bVar1) {
        bVar1 = iVar2 <= iVar3;
        iVar2 = iVar2 - (uint)(iVar3 < iVar2);
      }
    }
    else {
      fVar5 = (float)(iVar3 * iVar2) / fragmentsPerVertices;
      for (; (int)(fVar5 + *(float *)(&DAT_009ed69c + (ulong)(fVar5 < 0.0) * 4)) <
             (gridH + 1) * (gridW + 1); gridH = gridH - (uint)bVar1) {
        bVar1 = gridW <= gridH;
        gridW = gridW - (uint)(gridH < gridW);
      }
    }
  }
  local_1f8 = (float)(iVar3 * iVar2) / (float)((gridH + 1) * (gridW + 1));
LAB_0082ef95:
  local_1b0.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Requested fragment/vertex-ratio: ");
  de::floatToString_abi_cxx11_(&local_1d0,(de *)0x2,fragmentsPerVertices,precision);
  std::operator<<((ostream *)this_00,(string *)&local_1d0);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Computed fragment/vertex-ratio: ");
  de::floatToString_abi_cxx11_(&local_1f0,(de *)0x2,local_1f8,precision_00);
  std::operator<<((ostream *)this_00,(string *)&local_1f0);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  ShaderPerformanceMeasurer::setGridSize(&this->m_measurer,gridW,gridH);
  ShaderPerformanceMeasurer::setViewportSize(&this->m_measurer,iVar2,iVar3);
  return;
}

Assistant:

void ShaderPerformanceCase::setVertexFragmentRatio (float fragmentsPerVertices)
{
	const float	eps			= 0.01f;
	int			gridW		= 255;
	int			gridH		= 255;
	int			viewportW	= m_renderCtx.getRenderTarget().getWidth();
	int			viewportH	= m_renderCtx.getRenderTarget().getHeight();

	for (int i = 0; i < 10; i++)
	{
		int		numVert	= (gridW+1)*(gridH+1);
		int		numFrag	= viewportW*viewportH;
		float	ratio	= (float)numFrag / (float)numVert;

		if (de::abs(ratio - fragmentsPerVertices) < eps)
			break;
		else if (ratio < fragmentsPerVertices)
		{
			// Not enough fragments.
			numVert = deRoundFloatToInt32((float)numFrag / fragmentsPerVertices);

			while ((gridW+1)*(gridH+1) > numVert)
			{
				if (gridW > gridH)
					gridW -= 1;
				else
					gridH -= 1;
			}
		}
		else
		{
			// Not enough vertices.
			numFrag = deRoundFloatToInt32((float)numVert * fragmentsPerVertices);

			while (viewportW*viewportH > numFrag)
			{
				if (viewportW > viewportH)
					viewportW -= 1;
				else
					viewportH -= 1;
			}
		}
	}

	float finalRatio = (float)(viewportW*viewportH) / (float)((gridW+1)*(gridH+1));
	m_testCtx.getLog() << TestLog::Message << "Requested fragment/vertex-ratio: " << de::floatToString(fragmentsPerVertices, 2) << "\n"
										   << "Computed fragment/vertex-ratio: " << de::floatToString(finalRatio, 2)
					   << TestLog::EndMessage;

	setGridSize(gridW, gridH);
	setViewportSize(viewportW, viewportH);
}